

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags,bool override_previous_tooltip)

{
  ImGuiWindow *pIVar1;
  ImGuiWindowFlags flags;
  ImGuiWindow *window;
  char window_name [16];
  ImGuiContext *g;
  bool override_previous_tooltip_local;
  ImGuiWindowFlags extra_flags_local;
  
  window_name._8_8_ = GImGui;
  ImFormatString((char *)&window,0x10,"##Tooltip_%02d",(ulong)(uint)GImGui->TooltipOverrideCount);
  if (((override_previous_tooltip) &&
      (pIVar1 = FindWindowByName((char *)&window), pIVar1 != (ImGuiWindow *)0x0)) &&
     ((pIVar1->Active & 1U) != 0)) {
    pIVar1->Hidden = true;
    pIVar1->HiddenFramesCanSkipItems = 1;
    *(int *)(window_name._8_8_ + 0x2ed4) = *(int *)(window_name._8_8_ + 0x2ed4) + 1;
    ImFormatString((char *)&window,0x10,"##Tooltip_%02d");
  }
  Begin((char *)&window,(bool *)0x0,extra_flags | 0x20c0347);
  return;
}

Assistant:

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags, bool override_previous_tooltip)
{
    ImGuiContext& g = *GImGui;
    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (override_previous_tooltip)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                window->Hidden = true;
                window->HiddenFramesCanSkipItems = 1;
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip|ImGuiWindowFlags_NoInputs|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize;
    Begin(window_name, NULL, flags | extra_flags);
}